

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allphone_search.c
# Opt level: O2

int allphone_search_start(ps_search_t *search)

{
  bin_mdef_t *pbVar1;
  hmm_t *phVar2;
  short sVar3;
  char *fmt;
  long ln;
  uint uVar4;
  int iVar5;
  ps_searchfuncs_t **pppVar6;
  
  pbVar1 = search->acmod->mdef;
  iVar5 = 0;
  while (uVar4 = (uint)(short)iVar5, (int)uVar4 < pbVar1->n_ciphone) {
    pppVar6 = &(search[1].pls)->vt + uVar4;
    while (phVar2 = (hmm_t *)*pppVar6, phVar2 != (hmm_t *)0x0) {
      hmm_clear(phVar2);
      pppVar6 = (ps_searchfuncs_t **)(phVar2[1].score + 4);
    }
    iVar5 = uVar4 + 1;
  }
  *(undefined8 *)((long)&search[1].hyp_str + 4) = 0;
  blkarray_list_reset((blkarray_list_t *)search[1].last_link);
  *(undefined4 *)&search[1].d2p = 0;
  sVar3 = (short)pbVar1->sil;
  if (sVar3 < 0) {
    fmt = "Cannot find CI-phone %s\n";
    ln = 0x2b9;
  }
  else {
    pppVar6 = &(search[1].pls)->vt + sVar3;
    while (phVar2 = (hmm_t *)*pppVar6, phVar2 != (hmm_t *)0x0) {
      if (*(int *)&phVar2[1].ctx == (int)sVar3) {
        hmm_enter(phVar2,0,0,0);
        ptmr_reset((ptmr_t *)&search[1].start_wid);
        ptmr_start((ptmr_t *)&search[1].start_wid);
        return 0;
      }
      pppVar6 = (ps_searchfuncs_t **)(phVar2[1].score + 4);
    }
    fmt = "Cannot find HMM for %s\n";
    ln = 700;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/allphone_search.c"
          ,ln,fmt,"SIL");
  exit(1);
}

Assistant:

int
allphone_search_start(ps_search_t * search)
{
    allphone_search_t *allphs;
    bin_mdef_t *mdef;
    s3cipid_t ci;
    phmm_t *p;

    allphs = (allphone_search_t *) search;
    mdef = search->acmod->mdef;

    /* Reset all HMMs. */
    for (ci = 0; ci < bin_mdef_n_ciphone(mdef); ci++) {
        for (p = allphs->ci_phmm[(unsigned) ci]; p; p = p->next) {
            hmm_clear(&(p->hmm));
        }
    }

    allphs->n_hmm_eval = 0;
    allphs->n_sen_eval = 0;

    /* Free history nodes, if any */
    blkarray_list_reset(allphs->history);

    /* Initialize start state of the SILENCE PHMM */
    allphs->frame = 0;
    ci = bin_mdef_silphone(mdef);
    if (NOT_S3CIPID(ci))
        E_FATAL("Cannot find CI-phone %s\n", S3_SILENCE_CIPHONE);
    for (p = allphs->ci_phmm[ci]; p && (p->pid != ci); p = p->next);
    if (!p)
        E_FATAL("Cannot find HMM for %s\n", S3_SILENCE_CIPHONE);
    hmm_enter(&(p->hmm), 0, 0, allphs->frame);

    ptmr_reset(&allphs->perf);
    ptmr_start(&allphs->perf);

    return 0;
}